

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall notch::core::FullyConnectedLayer::calcOutput(FullyConnectedLayer *this)

{
  element_type *peVar1;
  size_t sVar2;
  undefined4 *puVar3;
  float *__last;
  float *__first;
  undefined4 extraout_XMM0_Da;
  
  peVar1 = (this->super_ABackpropLayer).shared.outputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = (this->inducedLocalField)._M_size;
  __first = (this->inducedLocalField)._M_data;
  __last = __first + sVar2;
  if (sVar2 == 0) {
    __last = (float *)0x0;
    __first = (float *)0x0;
  }
  if (peVar1->_M_size == 0) {
    puVar3 = (undefined4 *)0x0;
    for (; __first != __last; __first = __first + 1) {
      (*this->activationFunction->_vptr_Activation[1])(*__first);
      *puVar3 = extraout_XMM0_Da;
      puVar3 = puVar3 + 1;
    }
    return;
  }
  ::std::transform<float*,float*,notch::core::FullyConnectedLayer::calcOutput()::_lambda(float)_1_>
            (__first,__last,peVar1->_M_data,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void calcOutput() {
        Array &outputs = *shared.outputBuffer;
        std::transform(std::begin(inducedLocalField),
                       std::end(inducedLocalField),
                       std::begin(outputs),
                       [&](float y) { return (*activationFunction)(y); });
    }